

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O2

void textcolor_cb(Fl_Button *i,void *v)

{
  Fl_Type *pFVar1;
  bool bVar2;
  int iVar3;
  Fl_Color FVar4;
  Fl_Widget_Type *q;
  Fl_Type **ppFVar5;
  Fl_Color local_44;
  int s;
  Fl_Font n;
  Fl_Button *local_38;
  
  if ((char *)v == "LOAD") {
    iVar3 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x2b])(current_widget,0,&n,&s,&local_44)
    ;
    if (iVar3 == 0) {
      Fl_Widget::deactivate(&i->super_Fl_Widget);
      return;
    }
    Fl_Widget::activate(&i->super_Fl_Widget);
  }
  else {
    FVar4 = (i->super_Fl_Widget).color_;
    local_44 = fl_show_colormap(FVar4);
    if (local_44 == FVar4) {
      return;
    }
    bVar2 = false;
    ppFVar5 = &Fl_Type::first;
    local_38 = i;
    while (i = local_38, pFVar1 = *ppFVar5, pFVar1 != (Fl_Type *)0x0) {
      if ((pFVar1->selected != '\0') && (iVar3 = (*pFVar1->_vptr_Fl_Type[0x17])(pFVar1), iVar3 != 0)
         ) {
        (*pFVar1->_vptr_Fl_Type[0x2b])(pFVar1,3,&n,&s,&local_44);
        Fl_Widget::redraw((Fl_Widget *)pFVar1[1].prev);
        bVar2 = true;
      }
      ppFVar5 = &pFVar1->next;
    }
    if (bVar2) {
      set_modflag(1);
    }
  }
  (i->super_Fl_Widget).color_ = local_44;
  FVar4 = fl_contrast(0x38,local_44);
  (i->super_Fl_Widget).label_.color = FVar4;
  Fl_Widget::redraw(&i->super_Fl_Widget);
  return;
}

Assistant:

void textcolor_cb(Fl_Button* i, void* v) {
  Fl_Font n; int s; Fl_Color c;
  if (v == LOAD) {
    if (!current_widget->textstuff(0,n,s,c)) {i->deactivate(); return;}
    i->activate();
  } else {
    int mod = 0;
    c = i->color();
    Fl_Color d = fl_show_colormap(c);
    if (d == c) return;
    c = d;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	q->textstuff(3,n,s,c); q->o->redraw();
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
  i->color(c); i->labelcolor(fl_contrast(FL_BLACK,c)); i->redraw();
}